

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_binding_resolver.cpp
# Opt level: O1

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::ColumnBindingResolver::VisitReplace
          (ColumnBindingResolver *this,BoundColumnRefExpression *expr,
          unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *expr_ptr)

{
  ExpressionType *this_00;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var1;
  _Head_base<0UL,_duckdb::Expression_*,_false> params_2;
  _func_int **pp_Var2;
  reference pvVar3;
  InternalException *this_01;
  vector<duckdb::ColumnBinding,_true> *bindings;
  bool bVar4;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  _func_int **local_58;
  string local_50;
  
  this_00 = &(expr->super_Expression).super_BaseExpression.type;
  local_98._M_dataplus._M_p = (pointer)0x0;
  bVar4 = (expr->super_Expression).super_BaseExpression.alias._M_dataplus._M_p !=
          *(pointer *)&(expr->super_Expression).super_BaseExpression.type;
  if (bVar4) {
    do {
      pvVar3 = vector<duckdb::ColumnBinding,_true>::operator[]
                         ((vector<duckdb::ColumnBinding,_true> *)this_00,
                          (size_type)local_98._M_dataplus._M_p);
      if ((expr_ptr[0xb].
           super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
           super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
           super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
           super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl ==
           (Expression *)pvVar3->table_index) &&
         (expr_ptr[0xc].
          super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
          super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
          super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
          super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl ==
          (Expression *)pvVar3->column_index)) {
        if ((expr->super_Expression).super_BaseExpression.alias.field_2._M_local_buf[0] == '\x01') {
          (this->super_LogicalOperatorVisitor)._vptr_LogicalOperatorVisitor = (_func_int **)0x0;
        }
        else {
          make_uniq<duckdb::BoundReferenceExpression,std::__cxx11::string_const&,duckdb::LogicalType&,unsigned_long&>
                    ((duckdb *)&local_58,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (expr_ptr + 2),(LogicalType *)(expr_ptr + 7),(unsigned_long *)&local_98);
          pp_Var2 = local_58;
          local_58 = (_func_int **)0x0;
          (this->super_LogicalOperatorVisitor)._vptr_LogicalOperatorVisitor = pp_Var2;
        }
        if (bVar4) {
          return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this;
        }
        break;
      }
      local_98._M_dataplus._M_p = local_98._M_dataplus._M_p + 1;
      bVar4 = local_98._M_dataplus._M_p <
              (pointer)((long)(expr->super_Expression).super_BaseExpression.alias._M_dataplus._M_p -
                        *(long *)&(expr->super_Expression).super_BaseExpression.type >> 4);
    } while (bVar4);
  }
  this_01 = (InternalException *)__cxa_allocate_exception(0x10);
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_98,"Failed to bind column reference \"%s\" [%d.%d] (bindings: %s)","")
  ;
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  _Var1._M_head_impl =
       expr_ptr[2].super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
       _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t
       .super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
       super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,_Var1._M_head_impl,
             (long)&(_Var1._M_head_impl)->super_BaseExpression +
             (long)&(expr_ptr[3].
                     super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
                     _M_t.
                     super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                     .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl)->
                    super_BaseExpression);
  _Var1._M_head_impl =
       expr_ptr[0xb].super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
       _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t
       .super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
       super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  params_2._M_head_impl =
       expr_ptr[0xc].super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
       _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t
       .super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
       super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  LogicalOperator::ColumnBindingsToString_abi_cxx11_(&local_50,(LogicalOperator *)this_00,bindings);
  InternalException::
  InternalException<std::__cxx11::string,unsigned_long,unsigned_long,std::__cxx11::string>
            (this_01,&local_98,&local_78,(unsigned_long)_Var1._M_head_impl,
             (unsigned_long)params_2._M_head_impl,&local_50);
  __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

unique_ptr<Expression> ColumnBindingResolver::VisitReplace(BoundColumnRefExpression &expr,
                                                           unique_ptr<Expression> *expr_ptr) {
	D_ASSERT(expr.depth == 0);
	// check the current set of column bindings to see which index corresponds to the column reference
	for (idx_t i = 0; i < bindings.size(); i++) {
		if (expr.binding == bindings[i]) {
			if (verify_only) {
				// in verification mode
				return nullptr;
			}
			return make_uniq<BoundReferenceExpression>(expr.GetAlias(), expr.return_type, i);
		}
	}
	// LCOV_EXCL_START
	// could not bind the column reference, this should never happen and indicates a bug in the code
	// generate an error message
	throw InternalException("Failed to bind column reference \"%s\" [%d.%d] (bindings: %s)", expr.GetAlias(),
	                        expr.binding.table_index, expr.binding.column_index,
	                        LogicalOperator::ColumnBindingsToString(bindings));
	// LCOV_EXCL_STOP
}